

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasExtensionFromFile
               (Message *msg,FileDescriptor *file,Options *options,bool *has_opt_codesize_extension)

{
  FieldDescriptor *this;
  bool bVar1;
  int iVar2;
  FileOptions_OptimizeMode FVar3;
  Descriptor *pDVar4;
  Message *pMVar5;
  int index;
  int iVar6;
  Reflection *this_00;
  pointer ppFVar7;
  pointer ppFVar8;
  bool bVar9;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_58;
  pointer local_38;
  
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(msg->super_MessageLite)._vptr_MessageLite[0x11])();
  Reflection::ListFields(this_00,msg,&local_58);
  bVar9 = local_58.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_58.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar9) {
    local_38 = local_58.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppFVar7 = local_58.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppFVar8 = local_58.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this = *ppFVar8;
      pDVar4 = FieldDescriptor::message_type(this);
      if (pDVar4 == (Descriptor *)0x0) {
        iVar6 = 3;
      }
      else {
        if (((byte)this[1] & 8) != 0) {
          pDVar4 = FieldDescriptor::message_type(this);
          if (*(FileDescriptor **)(pDVar4 + 0x10) == file) {
            iVar6 = 1;
            goto LAB_00242d09;
          }
          if ((has_opt_codesize_extension != (bool *)0x0) &&
             (FVar3 = GetOptimizeFor(*(FileDescriptor **)(pDVar4 + 0x10),options,(bool *)0x0),
             FVar3 == FileOptions_OptimizeMode_CODE_SIZE)) {
            *has_opt_codesize_extension = true;
          }
        }
        if ((~(byte)this[1] & 0x60) == 0) {
          iVar6 = 0;
          do {
            index = iVar6;
            iVar2 = Reflection::FieldSize(this_00,msg,this);
            if (iVar2 <= index) {
              iVar6 = 4;
              goto LAB_00242cf2;
            }
            pMVar5 = Reflection::GetRepeatedMessage(this_00,msg,this,index);
            bVar1 = HasExtensionFromFile(pMVar5,file,options,has_opt_codesize_extension);
            iVar6 = index + 1;
          } while (!bVar1);
          iVar6 = 1;
LAB_00242cf2:
          ppFVar7 = local_38;
          if (iVar2 <= index) {
LAB_00242d00:
            iVar6 = 0;
          }
        }
        else {
          pMVar5 = Reflection::GetMessage(this_00,msg,this,(MessageFactory *)0x0);
          bVar1 = HasExtensionFromFile(pMVar5,file,options,has_opt_codesize_extension);
          iVar6 = 1;
          if (!bVar1) goto LAB_00242d00;
        }
      }
LAB_00242d09:
      if ((iVar6 != 3) && (iVar6 != 0)) break;
      ppFVar8 = ppFVar8 + 1;
      bVar9 = ppFVar8 != ppFVar7;
    } while (bVar9);
  }
  if (local_58.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar9;
}

Assistant:

static bool HasExtensionFromFile(const Message& msg, const FileDescriptor* file,
                                 const Options& options,
                                 bool* has_opt_codesize_extension) {
  std::vector<const FieldDescriptor*> fields;
  auto reflection = msg.GetReflection();
  reflection->ListFields(msg, &fields);
  for (auto field : fields) {
    const auto* field_msg = field->message_type();
    if (field_msg == nullptr) {
      // It so happens that enums Is_Valid are still generated so enums work.
      // Only messages have potential problems.
      continue;
    }
    // If this option has an extension set AND that extension is defined in the
    // same file we have bootstrap problem.
    if (field->is_extension()) {
      const auto* msg_extension_file = field->message_type()->file();
      if (msg_extension_file == file) return true;
      if (has_opt_codesize_extension &&
          GetOptimizeFor(msg_extension_file, options) ==
              FileOptions::CODE_SIZE) {
        *has_opt_codesize_extension = true;
      }
    }
    // Recurse in this field to see if there is a problem in there
    if (field->is_repeated()) {
      for (int i = 0; i < reflection->FieldSize(msg, field); i++) {
        if (HasExtensionFromFile(reflection->GetRepeatedMessage(msg, field, i),
                                 file, options, has_opt_codesize_extension)) {
          return true;
        }
      }
    } else {
      if (HasExtensionFromFile(reflection->GetMessage(msg, field), file,
                               options, has_opt_codesize_extension)) {
        return true;
      }
    }
  }
  return false;
}